

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O2

uint64_t llvm::hashing::detail::hash_short(char *s,size_t length,uint64_t seed)

{
  uint64_t uVar1;
  
  if (length - 4 < 5) {
    uVar1 = hash_4to8_bytes(s,length,seed);
    return uVar1;
  }
  if (length - 9 < 8) {
    uVar1 = hash_9to16_bytes(s,length,seed);
    return uVar1;
  }
  if (length - 0x11 < 0x10) {
    uVar1 = hash_17to32_bytes(s,length,seed);
    return uVar1;
  }
  if (0x20 < length) {
    uVar1 = hash_33to64_bytes(s,length,seed);
    return uVar1;
  }
  if (length != 0) {
    uVar1 = hash_1to3_bytes(s,length,seed);
    return uVar1;
  }
  return seed ^ 0x9ae16a3b2f90404f;
}

Assistant:

inline uint64_t hash_short(const char *s, size_t length, uint64_t seed) {
  if (length >= 4 && length <= 8)
    return hash_4to8_bytes(s, length, seed);
  if (length > 8 && length <= 16)
    return hash_9to16_bytes(s, length, seed);
  if (length > 16 && length <= 32)
    return hash_17to32_bytes(s, length, seed);
  if (length > 32)
    return hash_33to64_bytes(s, length, seed);
  if (length != 0)
    return hash_1to3_bytes(s, length, seed);

  return k2 ^ seed;
}